

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetline.c
# Opt level: O1

char * fgetline(FILE *fp)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  char *ptr;
  size_t oldlen;
  size_t size;
  size_t local_38;
  
  oldlen = 0;
  __s = (char *)safemalloc(0x200,1,0);
  local_38 = 0x200;
  pcVar1 = fgets(__s,0x200,(FILE *)fp);
  ptr = __s;
  if (pcVar1 != (char *)0x0) {
    oldlen = 0;
    do {
      sVar2 = strlen(__s);
      oldlen = sVar2 + oldlen;
      if ((oldlen != 0) && (ptr[oldlen - 1] == '\n')) break;
      ptr = (char *)safegrowarray(ptr,&local_38,1,oldlen,0x200,true);
      __s = ptr + oldlen;
      pcVar1 = fgets(__s,(int)local_38 - (int)oldlen,(FILE *)fp);
    } while (pcVar1 != (char *)0x0);
  }
  if (oldlen == 0) {
    safefree(ptr);
    ptr = (char *)0x0;
  }
  else {
    ptr[oldlen] = '\0';
  }
  return ptr;
}

Assistant:

char *fgetline(FILE *fp)
{
    char *ret = snewn(512, char);
    size_t size = 512, len = 0;
    while (fgets(ret + len, size - len, fp)) {
        len += strlen(ret + len);
        if (len > 0 && ret[len-1] == '\n')
            break;                     /* got a newline, we're done */
        sgrowarrayn_nm(ret, size, len, 512);
    }
    if (len == 0) {                    /* first fgets returned NULL */
        sfree(ret);
        return NULL;
    }
    ret[len] = '\0';
    return ret;
}